

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

void al_set_display_icons(ALLEGRO_DISPLAY *display,int num_icons,ALLEGRO_BITMAP **icons)

{
  undefined8 in_RDX;
  int in_ESI;
  long in_RDI;
  int i;
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
  }
  if (*(long *)(*(long *)(in_RDI + 0x80) + 200) != 0) {
    (**(code **)(*(long *)(in_RDI + 0x80) + 200))(in_RDI,in_ESI,in_RDX);
  }
  return;
}

Assistant:

void al_set_display_icons(ALLEGRO_DISPLAY *display,
   int num_icons, ALLEGRO_BITMAP *icons[])
{
   int i;

   ASSERT(display);
   ASSERT(num_icons >= 1);
   ASSERT(icons);
   for (i = 0; i < num_icons; i++) {
      ASSERT(icons[i]);
   }

   if (display->vt->set_icons) {
      display->vt->set_icons(display, num_icons, icons);
   }
}